

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
(anonymous_namespace)::get_env<char_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,_anonymous_namespace_ *this,string *_env_name,char *_default)

{
  uint *puVar1;
  char *pcVar2;
  stringstream _ss;
  stringstream _ss_1;
  stringstream asStack_328 [16];
  long local_318 [3];
  uint auStack_300 [88];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  pcVar2 = getenv(*(char **)this);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)_env_name,(allocator<char> *)asStack_328);
  }
  else {
    std::__cxx11::stringstream::stringstream(asStack_328);
    puVar1 = (uint *)((long)auStack_300 + *(long *)(local_318[0] + -0x18));
    *puVar1 = *puVar1 | 0x1000;
    std::operator<<((ostream *)local_318,pcVar2);
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,pcVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::__cxx11::stringstream::~stringstream(asStack_328);
  }
  return __return_storage_ptr__;
}

Assistant:

auto get_env(const std::string &_env_name, Tp _default) {
  const char *_env_val = std::getenv(_env_name.c_str());

  if (_env_val) {
    std::stringstream _ss{};
    _ss << std::skipws << _env_val;
    if constexpr (std::is_same<std::decay_t<Tp>, const char *>::value) {
      std::stringstream _ss{};
      _ss << _env_val;
      return _ss.str();
    } else {
      Tp _val{};
      std::istringstream{_env_val} >> _val;
      return _val;
    }
  }

  if constexpr (std::is_same<std::decay_t<Tp>, const char *>::value) {
    return std::string{_default};
  } else {
    return _default;
  }
}